

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void add_intrinsic_4f_s2_2f_2f_2f(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *ret;
  MOJOSHADER_astDataType *dt2;
  
  ret = get_usertype(ctx,"float4");
  dt2 = get_usertype(ctx,"float2");
  add_intrinsic4(ctx,fn,ret,&ctx->dt_sampler2d,dt2,dt2,dt2);
  return;
}

Assistant:

static void add_intrinsic_4f_s2_2f_2f_2f(Context *ctx, const char *fn)
{
    const MOJOSHADER_astDataType *f4 = get_usertype(ctx, "float4");
    const MOJOSHADER_astDataType *f2 = get_usertype(ctx, "float2");
    add_intrinsic4(ctx, fn, f4, &ctx->dt_sampler2d, f2, f2, f2);
}